

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::IfcDoorStyle(IfcDoorStyle *this)

{
  *(undefined ***)&this->field_0x1d8 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x1e0 = 0;
  *(char **)&this->field_0x1e8 = "IfcDoorStyle";
  IfcTypeProduct::IfcTypeProduct(&this->super_IfcTypeProduct,&PTR_construction_vtable_24__0087b670);
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x150 = 0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x87b590;
  *(undefined8 *)&this->field_0x1d8 = 0x87b658;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = 0x87b5b8;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x87b5e0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = 0x87b608;
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x148 = 0x87b630;
  *(undefined1 **)&(this->super_IfcTypeProduct).field_0x158 = &this->field_0x168;
  *(undefined8 *)&this->field_0x160 = 0;
  this->field_0x168 = 0;
  (this->ConstructionType)._M_dataplus._M_p = (pointer)&(this->ConstructionType).field_2;
  (this->ConstructionType)._M_string_length = 0;
  (this->ConstructionType).field_2._M_local_buf[0] = '\0';
  (this->ParameterTakesPrecedence)._M_dataplus._M_p =
       (pointer)&(this->ParameterTakesPrecedence).field_2;
  (this->ParameterTakesPrecedence)._M_string_length = 0;
  (this->ParameterTakesPrecedence).field_2._M_local_buf[0] = '\0';
  (this->Sizeable)._M_dataplus._M_p = (pointer)&(this->Sizeable).field_2;
  (this->Sizeable)._M_string_length = 0;
  (this->Sizeable).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}